

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deInt32.h
# Opt level: O0

deUint32 deInt32Hash(deInt32 a)

{
  uint uVar1;
  deUint32 key;
  deInt32 a_local;
  
  uVar1 = (a ^ 0x3dU ^ (uint)a >> 0x10) * 9;
  uVar1 = (uVar1 ^ uVar1 >> 4) * 0x27d4eb2d;
  return uVar1 ^ uVar1 >> 0xf;
}

Assistant:

DE_INLINE deUint32 deInt32Hash (deInt32 a)
{
	/* From: http://www.concentric.net/~Ttwang/tech/inthash.htm */
	deUint32 key = (deUint32)a;
	key = (key ^ 61) ^ (key >> 16);
	key = key + (key << 3);
	key = key ^ (key >> 4);
	key = key * 0x27d4eb2d; /* prime/odd constant */
	key = key ^ (key >> 15);
	return key;
}